

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_deserialize_struct
          (t_netstd_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  ostream *poVar1;
  string sStack_88;
  string local_68;
  string local_48;
  
  if ((this->union_ == true) && (tstruct->is_union_ == true)) {
    t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
    poVar1 = std::operator<<(out,(string *)&local_68);
    poVar1 = std::operator<<(poVar1,(string *)prefix);
    poVar1 = std::operator<<(poVar1," = await ");
    type_name_abi_cxx11_(&sStack_88,this,&tstruct->super_t_type,true);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_88);
    poVar1 = std::operator<<(poVar1,".ReadAsync(iprot, ");
    poVar1 = std::operator<<(poVar1,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,");");
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
    poVar1 = std::operator<<(out,(string *)&local_68);
    poVar1 = std::operator<<(poVar1,(string *)prefix);
    poVar1 = std::operator<<(poVar1," = new ");
    type_name_abi_cxx11_(&sStack_88,this,&tstruct->super_t_type,true);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_88);
    poVar1 = std::operator<<(poVar1,"();");
    poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
    poVar1 = std::operator<<(poVar1,(string *)&local_48);
    poVar1 = std::operator<<(poVar1,"await ");
    poVar1 = std::operator<<(poVar1,(string *)prefix);
    poVar1 = std::operator<<(poVar1,".ReadAsync(iprot, ");
    poVar1 = std::operator<<(poVar1,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,");");
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::~string((string *)&sStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void t_netstd_generator::generate_deserialize_struct(ostream& out, t_struct* tstruct, string prefix)
{
    if (is_union_enabled() && tstruct->is_union())
    {
        out << indent() << prefix << " = await " << type_name(tstruct) << ".ReadAsync(iprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else
    {
        out << indent() << prefix << " = new " << type_name(tstruct) << "();" << endl
            << indent() << "await " << prefix << ".ReadAsync(iprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
}